

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

void __thiscall
cppcms::impl::
io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
::io_handler_binder_p2
          (io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
           *this,offset_in_fastcgi_to_subr *f,shared_ptr<cppcms::impl::cgi::fastcgi> *s,
          callback<void_(const_std::error_code_&,_unsigned_long)> *p1,
          pair<void_*,_unsigned_long> *p2)

{
  element_type *peVar1;
  undefined8 *in_RSI;
  shared_ptr<cppcms::impl::cgi::fastcgi> *in_RDI;
  undefined8 *in_R8;
  shared_ptr<cppcms::impl::cgi::fastcgi> *other;
  
  booster::callable<void_(const_std::error_code_&,_unsigned_long)>::callable
            ((callable<void_(const_std::error_code_&,_unsigned_long)> *)in_RDI);
  (in_RDI->super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__io_handler_binder_p2_00530728;
  peVar1 = (element_type *)*in_RSI;
  in_RDI[1].super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  in_RDI[1].super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  other = in_RDI + 2;
  std::shared_ptr<cppcms::impl::cgi::fastcgi>::shared_ptr(in_RDI,other);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RDI,
             (callback<void_(const_std::error_code_&,_unsigned_long)> *)other);
  in_RDI[3].super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_R8;
  in_RDI[4].super___shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_R8[1];
  return;
}

Assistant:

io_handler_binder_p2(F const &f,S const &s, P1 const &p1,P2 const &p2) : f_(f), s_(s), p1_(p1),p2_(p2) {}